

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int64_t estimate_yrd_for_sb(AV1_COMP *cpi,BLOCK_SIZE bs,MACROBLOCK *x,int64_t ref_best_rd,
                           RD_STATS *rd_stats)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  BLOCK_SIZE in_SIL;
  MACROBLOCK *in_RDI;
  int *in_R8;
  int s0;
  int s1;
  int skip_ctx;
  int64_t rd;
  MACROBLOCKD *xd;
  TX_SIZE in_stack_000001ae;
  BLOCK_SIZE in_stack_000001af;
  int64_t in_stack_000001b0;
  RD_STATS *in_stack_000001b8;
  MACROBLOCK *in_stack_000001c0;
  AV1_COMP *in_stack_000001c8;
  int in_stack_ffffffffffffffe8;
  int64_t local_8;
  
  if (in_RCX < 0) {
    local_8 = 0x7fffffffffffffff;
  }
  else {
    av1_subtract_plane(in_RDI,in_SIL,in_stack_ffffffffffffffe8);
    local_8 = av1_estimate_txfm_yrd
                        (in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,
                         in_stack_000001af,in_stack_000001ae);
    if (local_8 != 0x7fffffffffffffff) {
      iVar1 = av1_get_skip_txfm_context((MACROBLOCKD *)(in_RDX + 0x1a0));
      if ((char)in_R8[8] == '\0') {
        *in_R8 = *(int *)(in_RDX + 0x8c80 + (long)iVar1 * 8) + *in_R8;
      }
      else {
        *in_R8 = *(int *)(in_RDX + 0x8c84 + (long)iVar1 * 8);
      }
    }
  }
  return local_8;
}

Assistant:

static int64_t estimate_yrd_for_sb(const AV1_COMP *const cpi, BLOCK_SIZE bs,
                                   MACROBLOCK *x, int64_t ref_best_rd,
                                   RD_STATS *rd_stats) {
  MACROBLOCKD *const xd = &x->e_mbd;
  if (ref_best_rd < 0) return INT64_MAX;
  av1_subtract_plane(x, bs, 0);
  const int64_t rd = av1_estimate_txfm_yrd(cpi, x, rd_stats, ref_best_rd, bs,
                                           max_txsize_rect_lookup[bs]);
  if (rd != INT64_MAX) {
    const int skip_ctx = av1_get_skip_txfm_context(xd);
    if (rd_stats->skip_txfm) {
      const int s1 = x->mode_costs.skip_txfm_cost[skip_ctx][1];
      rd_stats->rate = s1;
    } else {
      const int s0 = x->mode_costs.skip_txfm_cost[skip_ctx][0];
      rd_stats->rate += s0;
    }
  }
  return rd;
}